

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimeline.cpp
# Opt level: O0

void __thiscall QTimeLine::stop(QTimeLine *this)

{
  QBasicTimer *in_RDI;
  QTimeLinePrivate *unaff_retaddr;
  QTimeLinePrivate *d;
  
  d_func((QTimeLine *)0x71e137);
  QBasicTimer::stop(in_RDI);
  QTimeLinePrivate::setState(unaff_retaddr,(State)((ulong)in_RDI >> 0x20));
  return;
}

Assistant:

void QTimeLine::stop()
{
    Q_D(QTimeLine);
    d->basicTimer.stop();
    d->setState(NotRunning);
}